

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O1

errr finish_parse_quest(parser *p)

{
  long *plVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  quest **ppqVar7;
  quest *pqVar8;
  long *plVar9;
  long lVar10;
  uint16_t uVar11;
  long lVar12;
  ulong uVar13;
  
  z_info->quest_max = 0;
  plVar9 = (long *)parser_priv(p);
  if (plVar9 != (long *)0x0) {
    uVar11 = z_info->quest_max;
    do {
      uVar11 = uVar11 + 1;
      plVar9 = (long *)*plVar9;
    } while (plVar9 != (long *)0x0);
    z_info->quest_max = uVar11;
  }
  quests = (quest *)mem_zalloc((ulong)z_info->quest_max * 0x30);
  uVar2 = z_info->quest_max;
  plVar9 = (long *)parser_priv(p);
  if (plVar9 != (long *)0x0) {
    lVar12 = (ulong)uVar2 * 0x30;
    uVar13 = (ulong)uVar2;
    do {
      pqVar8 = quests;
      ppqVar7 = &quests->next;
      lVar10 = plVar9[1];
      lVar3 = plVar9[2];
      lVar4 = plVar9[3];
      lVar5 = plVar9[4];
      lVar6 = plVar9[5];
      plVar1 = (long *)((long)&quests[-1].next + lVar12);
      *plVar1 = *plVar9;
      plVar1[1] = lVar10;
      plVar1 = (long *)((long)pqVar8 + lVar12 + -0x10);
      *plVar1 = lVar5;
      plVar1[1] = lVar6;
      plVar1 = (long *)((long)pqVar8 + lVar12 + -0x20);
      *plVar1 = lVar3;
      plVar1[1] = lVar4;
      *(char *)((long)pqVar8 + lVar12 + -0x28) = (char)uVar13 + -1;
      plVar1 = (long *)*plVar9;
      lVar10 = (long)ppqVar7 + lVar12;
      if ((long)(ulong)z_info->quest_max <= (long)uVar13) {
        lVar10 = 0;
      }
      *(long *)((long)&pqVar8[-1].next + lVar12) = lVar10;
      mem_free(plVar9);
      lVar12 = lVar12 + -0x30;
      plVar9 = plVar1;
      uVar13 = uVar13 - 1;
    } while (plVar1 != (long *)0x0);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_quest(struct parser *p) {
	struct quest *quest, *next = NULL;
	int count;

	/* Count the entries */
	z_info->quest_max = 0;
	quest = parser_priv(p);
	while (quest) {
		z_info->quest_max++;
		quest = quest->next;
	}

	/* Allocate the direct access list and copy the data to it */
	quests = mem_zalloc(z_info->quest_max * sizeof(*quest));
	count = z_info->quest_max - 1;
	for (quest = parser_priv(p); quest; quest = next, count--) {
		memcpy(&quests[count], quest, sizeof(*quest));
		quests[count].index = count;
		next = quest->next;
		if (count < z_info->quest_max - 1)
			quests[count].next = &quests[count + 1];
		else
			quests[count].next = NULL;

		mem_free(quest);
	}

	parser_destroy(p);
	return 0;
}